

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_himawari8.cc
# Opt level: O0

timespec __thiscall Himawari8ImageHandler::getTime(Himawari8ImageHandler *this,File *f)

{
  timespec tVar1;
  size_type sVar2;
  char *__s;
  char *pcVar3;
  char *ptr;
  tm tm;
  char *format;
  char *buf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  char in_stack_000000c7;
  string *in_stack_000000c8;
  string text;
  timespec time;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  string local_a8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_70 [40];
  string local_48 [48];
  time_t local_18;
  _Base_ptr p_Stack_10;
  
  local_18 = 0;
  p_Stack_10 = (_Base_ptr)0x0;
  lrit::File::getHeader<lrit::AnnotationHeader>((File *)local_70);
  std::__cxx11::string::string(local_48,(string *)(local_70 + 8));
  lrit::AnnotationHeader::~AnnotationHeader((AnnotationHeader *)0x2a80ee);
  std::__cxx11::string::string(local_a8,local_48);
  util::split(in_stack_000000c8,in_stack_000000c7);
  std::__cxx11::string::~string(local_a8);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_88);
  if (sVar2 == 4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_88,2);
    __s = (char *)std::__cxx11::string::c_str();
    memset(&stack0xffffffffffffff00,0,0x38);
    pcVar3 = strptime(__s,"%Y%m%d%H%M",(tm *)&stack0xffffffffffffff00);
    if (pcVar3 == __s + 0xc) {
      local_18 = mktime((tm *)&stack0xffffffffffffff00);
      p_Stack_10 = (_Base_ptr)0x0;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_48);
  tVar1.tv_nsec = (__syscall_slong_t)p_Stack_10;
  tVar1.tv_sec = local_18;
  return tVar1;
}

Assistant:

struct timespec Himawari8ImageHandler::getTime(const lrit::File& f) const {
  struct timespec time = {0, 0};

  // Time of Himawari images is encoded in filename.
  // The LRIT time stamp header is bogus.
  // Example annotation: IMG_DK01VIS_201712162250_003.lrit
  auto text = f.getHeader<lrit::AnnotationHeader>().text;
  auto parts = split(text, '_');
  if (parts.size() != 4) {
    return time;
  }

  const char* buf = parts[2].c_str();
  const char* format = "%Y%m%d%H%M";
  struct tm tm;
  memset(&tm, 0, sizeof(tm));
  auto ptr = strptime(buf, format, &tm);

  // Only use time if strptime was successful
  if (ptr == (buf + 12)) {
    time.tv_sec = mktime(&tm);
    time.tv_nsec = 0;
  }

  return time;
}